

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint32_t __fd_00;
  uint uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  uint32_t ipaddr;
  uint16_t port_local;
  char *addr_local;
  Socket *this_local;
  
  __fd_00 = resolveAddress((char *)CONCAT44(in_register_00000034,__fd));
  uVar2 = (ulong)__fd_00;
  if (__fd_00 == 0xffffffff) {
    this_local._7_1_ = 0;
  }
  else {
    uVar1 = bind(this,__fd_00,(sockaddr *)((ulong)__addr & 0xffff),__len);
    uVar2 = (ulong)uVar1 & 0xffffffffffffff01;
    this_local._7_1_ = (undefined1)uVar2;
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool Socket::bind( const char * addr, uint16_t port )
{
    uint32_t ipaddr = resolveAddress(addr);
    if(ipaddr == 0xFFFFFFFF)
        return false;
    return bind(ipaddr, port);
}